

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_poll.c
# Opt level: O1

int mbedtls_platform_entropy_poll(void *data,uchar *output,size_t len,size_t *olen)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  FILE *__stream;
  size_t sVar4;
  utsname local_1ae;
  
  if (has_getrandom != -1) goto LAB_00138cb8;
  uname(&local_1ae);
  if (((byte)(local_1ae.release[0] - 0x33U) < 7) && (local_1ae.release[1] == '.')) {
    has_getrandom = 1;
    if (local_1ae.release[0] != '3') goto LAB_00138cb8;
    if (0xf5 < (byte)(local_1ae.release[2] - 0x3aU)) {
      bVar1 = local_1ae.release[2] - 0x30;
      uVar2 = (uint)bVar1;
      if ((byte)(local_1ae.release[3] - 0x30U) < 10) {
        uVar2 = ((uint)(byte)local_1ae.release[3] + ((uint)bVar1 + (uint)bVar1 * 4) * 2) - 0x30;
      }
      else {
        has_getrandom = 0;
        if ((byte)local_1ae.release[3] != 0x2e) goto LAB_00138cb8;
      }
      has_getrandom = (int)(0x10 < (int)uVar2);
      goto LAB_00138cb8;
    }
  }
  has_getrandom = 0;
LAB_00138cb8:
  if (has_getrandom == 0) {
    *olen = 0;
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) {
      return -0x3c;
    }
    sVar4 = fread(output,1,len,__stream);
    fclose(__stream);
    if (sVar4 != len) {
      return -0x3c;
    }
  }
  else {
    lVar3 = syscall(0x13e,output,len,0);
    if ((int)(uint)lVar3 < 0) {
      return -0x3c;
    }
    len = (size_t)((uint)lVar3 & 0x7fffffff);
  }
  *olen = len;
  return 0;
}

Assistant:

int mbedtls_platform_entropy_poll( void *data,
                           unsigned char *output, size_t len, size_t *olen )
{
    FILE *file;
    size_t read_len;
    ((void) data);

#if defined(HAVE_GETRANDOM)
    if( has_getrandom == -1 )
        has_getrandom = ( check_version_3_17_plus() == 0 );

    if( has_getrandom )
    {
        int ret;

        if( ( ret = getrandom_wrapper( output, len, 0 ) ) < 0 )
            return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

        *olen = ret;
        return( 0 );
    }
#endif /* HAVE_GETRANDOM */

    *olen = 0;

    file = fopen( "/dev/urandom", "rb" );
    if( file == NULL )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

    read_len = fread( output, 1, len, file );
    if( read_len != len )
    {
        fclose( file );
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );
    }

    fclose( file );
    *olen = len;

    return( 0 );
}